

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

iterator anon_unknown.dwarf_b1723::findByName<VulkanHppGenerator::EnumValueData>
                   (vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                    *values,string *name)

{
  borrowed_iterator_t<std::vector<VulkanHppGenerator::EnumValueData>_&> bVar1;
  string *name_local;
  vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
  *values_local;
  
  bVar1 = std::ranges::__find_if_fn::
          operator()<std::vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>_&,_std::identity,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_KhronosGroup[P]Vulkan_Hpp_VulkanHppGenerator_cpp:16952:42)>
                    ((__find_if_fn *)&std::ranges::find_if,values,name);
  return (iterator)bVar1._M_current;
}

Assistant:

typename std::vector<T>::iterator findByName( std::vector<T> & values, std::string const & name )
  {
    return std::ranges::find_if( values, [&name]( T const & value ) { return value.name == name; } );
  }